

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

string * __thiscall
gnuplotio::Gnuplot::file<std::vector<int,std::allocator<int>>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,Gnuplot *this,undefined8 arg,string *filename)

{
  ostream *poVar1;
  ostringstream cmdline;
  fstream tmp_stream;
  undefined1 local_228 [512];
  
  if (*(long *)(filename + 8) == 0) {
    make_tmpfile_abi_cxx11_((string *)&tmp_stream,this);
    std::__cxx11::string::operator=(filename,(string *)&tmp_stream);
    std::__cxx11::string::~string((string *)&tmp_stream);
  }
  std::fstream::fstream(&tmp_stream,*(char **)filename,_S_out);
  std::ios::copyfmt((ios *)(&tmp_stream + *(long *)(_tmp_stream + -0x18)));
  handle_colunwrap_tag<1ul,std::vector<int,std::allocator<int>>,gnuplotio::ModeText>(local_228,arg);
  std::fstream::close();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmdline);
  poVar1 = std::operator<<((ostream *)&cmdline," \'");
  poVar1 = std::operator<<(poVar1,filename);
  std::operator<<(poVar1,"\' ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmdline);
  std::fstream::~fstream(&tmp_stream);
  return __return_storage_ptr__;
}

Assistant:

std::string file(const T &arg, std::string filename, OrganizationMode) {
        if(filename.empty()) filename = make_tmpfile();
        std::fstream tmp_stream(filename.c_str(), std::fstream::out);
        tmp_stream.copyfmt(*this);
        top_level_array_sender(tmp_stream, arg, OrganizationMode(), ModeText());
        tmp_stream.close();

        std::ostringstream cmdline;
        // FIXME - hopefully filename doesn't contain quotes or such...
        cmdline << " '" << filename << "' ";
        return cmdline.str();
    }